

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum32.c
# Opt level: O1

void Hacl_Bignum32_bn_to_bytes_le(uint32_t len,uint32_t *b,uint8_t *res)

{
  ulong __n;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  size_t __n_00;
  undefined1 *__dest;
  undefined8 uStack_40;
  undefined1 auStack_38 [4];
  undefined1 auStack_34 [4];
  
  uVar2 = len - 1 & 0xfffffffc;
  uVar3 = (ulong)(uVar2 + 4);
  lVar1 = -(uVar3 + 0xf & 0xfffffffffffffff0);
  __dest = auStack_38 + lVar1;
  __n = (ulong)uVar2 + 4;
  __n_00 = 0;
  if (__n <= uVar3) {
    __n_00 = uVar3 - __n;
  }
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x13ee82;
  memset(__dest + (ulong)uVar2 + 4,0,__n_00);
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x13ee90;
  memcpy(__dest,b,__n);
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x13ee9e;
  memcpy(res,__dest,(ulong)len);
  return;
}

Assistant:

void Hacl_Bignum32_bn_to_bytes_le(uint32_t len, uint32_t *b, uint8_t *res)
{
  uint32_t bnLen = (len - 1U) / 4U + 1U;
  uint32_t tmpLen = 4U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < bnLen; i++)
  {
    store32_le(tmp + i * 4U, b[i]);
  }
  memcpy(res, tmp, len * sizeof (uint8_t));
}